

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveJSON.h
# Opt level: O2

void __thiscall
chrono::ChArchiveOutJSON::out_ref
          (ChArchiveOutJSON *this,ChValue *bVal,bool already_inserted,size_t obj_ID,size_t ext_ID)

{
  undefined1 *puVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  undefined4 extraout_var;
  _Elt_pointer pbVar6;
  ChStreamOutAscii *pCVar7;
  _Elt_pointer piVar8;
  undefined3 in_register_00000011;
  bool local_55;
  undefined4 local_54;
  size_t local_50;
  size_t local_48;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *local_40;
  int local_34;
  
  local_54 = CONCAT31(in_register_00000011,already_inserted);
  local_48 = ext_ID;
  iVar5 = (*bVal->_vptr_ChValue[3])(bVal);
  pcVar2 = *(char **)CONCAT44(extraout_var,iVar5);
  comma_cr(this);
  pbVar6 = (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pbVar6 == (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    pbVar6 = (this->is_array).c.super__Deque_base<bool,_std::allocator<bool>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x200;
  }
  local_50 = obj_ID;
  if (pbVar6[-1] == false) {
    indent(this);
    pCVar7 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"");
    pCVar7 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<(pCVar7,(bVal->_name)._M_dataplus._M_p);
    pCVar7 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar7,"\"");
    chrono::ChStreamOutAscii::operator<<(pCVar7,"\t: \n");
  }
  indent(this);
  chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"{ ");
  puVar1 = &(this->super_ChArchiveOut).field_0x104;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  local_40 = &this->nitems;
  local_34 = 0;
  std::deque<int,_std::allocator<int>_>::emplace_back<int>(&local_40->c,&local_34);
  local_55 = false;
  std::deque<bool,_std::allocator<bool>_>::emplace_back<bool>(&(this->is_array).c,&local_55);
  if (*pcVar2 != '\0') {
    comma_cr(this);
    indent(this);
    pCVar7 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       ((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"_type\"\t: ");
    pCVar7 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar7,"\"");
    pCVar7 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar7,pcVar2);
    chrono::ChStreamOutAscii::operator<<(pCVar7,"\"");
    piVar8 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar8 == (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar8 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    piVar8[-1] = piVar8[-1] + 1;
  }
  sVar4 = local_48;
  sVar3 = local_50;
  if ((char)local_54 == '\0') {
    comma_cr(this);
    indent(this);
    pCVar7 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       ((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"_object_ID\"\t: ");
    chrono::ChStreamOutAscii::operator<<(pCVar7,local_50);
    piVar8 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar8 == (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar8 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    piVar8[-1] = piVar8[-1] + 1;
    (*bVal->_vptr_ChValue[0xe])(bVal,this);
    (*bVal->_vptr_ChValue[0xd])(bVal,this);
    goto LAB_0012dd75;
  }
  if (local_50 == 0) {
    iVar5 = (*bVal->_vptr_ChValue[7])(bVal);
    if ((char)iVar5 != '\0') goto LAB_0012dc4c;
  }
  else {
LAB_0012dc4c:
    comma_cr(this);
    indent(this);
    pCVar7 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       ((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"_reference_ID\"\t: ");
    chrono::ChStreamOutAscii::operator<<(pCVar7,sVar3);
    piVar8 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar8 == (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar8 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    piVar8[-1] = piVar8[-1] + 1;
  }
  if (sVar4 != 0) {
    comma_cr(this);
    indent(this);
    pCVar7 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       ((ChStreamOutAscii *)(this->ostream + 0x2d0),"\"_external_ID\"\t: ");
    chrono::ChStreamOutAscii::operator<<(pCVar7,sVar4);
    piVar8 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (piVar8 == (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      piVar8 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
    }
    piVar8[-1] = piVar8[-1] + 1;
  }
LAB_0012dd75:
  puVar1 = &(this->super_ChArchiveOut).field_0x104;
  *(int *)puVar1 = *(int *)puVar1 + -1;
  std::deque<int,_std::allocator<int>_>::pop_back(&local_40->c);
  std::deque<bool,_std::allocator<bool>_>::pop_back(&(this->is_array).c);
  chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"\n");
  indent(this);
  chrono::ChStreamOutAscii::operator<<((ChStreamOutAscii *)(this->ostream + 0x2d0),"}");
  piVar8 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (piVar8 == (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                super__Deque_impl_data._M_finish._M_first) {
    piVar8 = (this->nitems).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  piVar8[-1] = piVar8[-1] + 1;
  return;
}

Assistant:

virtual void out_ref          (ChValue& bVal,  bool already_inserted, size_t obj_ID, size_t ext_ID)  {
          const char* classname = bVal.GetClassRegisteredName().c_str();
          comma_cr();
		  if (is_array.top() == false) {
			  indent();
			  (*ostream) << "\"" << bVal.name() << "\"" << "\t: \n";
		  }
          indent();
          (*ostream) << "{ ";
          
          ++tablevel;
          nitems.push(0);
          is_array.push(false);

          if(strlen(classname)>0) {
              comma_cr();
              indent();
              (*ostream) << "\"_type\"\t: "  << "\"" << classname << "\"";
              ++nitems.top();
          }
          
          if (!already_inserted) {
            comma_cr();
            indent();
            (*ostream) << "\"_object_ID\"\t: "  << obj_ID;
            ++nitems.top();
          
            // New Object, we have to full serialize it
            bVal.CallArchiveOutConstructor(*this);
            bVal.CallArchiveOut(*this);
          } else {
              if (obj_ID || bVal.IsNull() ) {
                comma_cr();
                indent();
                (*ostream) << "\"_reference_ID\"\t: "  << obj_ID;
                ++nitems.top();
              }
              if (ext_ID) {
                comma_cr();
                indent();
                (*ostream) << "\"_external_ID\"\t: "  << ext_ID;
                ++nitems.top();
              }
          }
          --tablevel;
          nitems.pop();
          is_array.pop();

          (*ostream) << "\n";
          indent();
          (*ostream) << "}";
          ++nitems.top();
      }